

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.cpp
# Opt level: O1

void __thiscall particle::collideWith(particle *this,particle *other)

{
  float fVar1;
  float fVar4;
  vec2f vVar2;
  vec2f vVar3;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = (this->position).x - (other->position).x;
  fVar7 = (this->position).y - (other->position).y;
  fVar1 = fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar6 = fVar6 * (1.0 / fVar1);
  fVar7 = fVar7 * (1.0 / fVar1);
  fVar1 = (this->velocity).x;
  fVar4 = (this->velocity).y;
  fVar5 = (fVar1 - (other->velocity).x) * fVar6 + (fVar4 - (other->velocity).y) * fVar7;
  if (fVar5 < 0.0) {
    fVar6 = fVar6 * fVar5;
    fVar7 = fVar7 * fVar5;
    vVar2.x = fVar1 - fVar6;
    vVar2.y = fVar4 - fVar7;
    this->velocity = vVar2;
    vVar3.x = (other->velocity).x + fVar6;
    vVar3.y = (other->velocity).y + fVar7;
    other->velocity = vVar3;
  }
  return;
}

Assistant:

void particle::collideWith(particle& other)
{
    vec2f direction = (position - other.position).getNormalized();
    vec2f::floatingType changeSpeed = (velocity - other.velocity) * direction;
    if(changeSpeed < 0)
    {
        vec2f change = changeSpeed * direction;
        velocity -= change;
        other.velocity += change;
    }
}